

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_list_column.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_false>_>_>
::Intrusive_list_column
          (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_false>_>_>
           *this,Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_false>_>_>
                 *column)

{
  Z2_field_operators *pZVar1;
  Pool_entry_constructor<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_false>_>_>_>
  *pPVar2;
  void *local_28;
  void *local_20;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_false>_>_>
  *local_18;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_false>_>_>
  *column_local;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_false>_>_>
  *this_local;
  
  local_18 = column;
  column_local = this;
  Row_access<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_false>_>_>
  ::Row_access(&this->super_Row_access_option,&column->super_Row_access_option);
  Column_dimension_holder<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_false>_>_>
  ::Column_dimension_holder
            (&this->super_Column_dimension_option,&local_18->super_Column_dimension_option);
  Chain_column_extra_properties<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_false>_>_>
  ::Chain_column_extra_properties
            (&this->super_Chain_column_option,&local_18->super_Chain_column_option);
  local_20 = (void *)0x0;
  pZVar1 = std::exchange<Gudhi::persistence_fields::Z2_field_operators*,decltype(nullptr)>
                     (&local_18->operators_,&local_20);
  this->operators_ = pZVar1;
  local_28 = (void *)0x0;
  pPVar2 = std::
           exchange<Gudhi::persistence_matrix::Pool_entry_constructor<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true,false,false>>>>*,decltype(nullptr)>
                     (&local_18->entryPool_,&local_28);
  this->entryPool_ = pPVar2;
  boost::intrusive::
  list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_false>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_false>_>::Matrix_column_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)1>_>_>_>
  ::list(&this->column_,&local_18->column_);
  return;
}

Assistant:

inline Intrusive_list_column<Master_matrix>::Intrusive_list_column(Intrusive_list_column&& column) noexcept
    : RA_opt(std::move(static_cast<RA_opt&>(column))),
      Dim_opt(std::move(static_cast<Dim_opt&>(column))),
      Chain_opt(std::move(static_cast<Chain_opt&>(column))),
      operators_(std::exchange(column.operators_, nullptr)),
      entryPool_(std::exchange(column.entryPool_, nullptr)),
      column_(std::move(column.column_))
{}